

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle.cpp
# Opt level: O0

PP_particle * __thiscall
PP_particle::operator=(PP_particle *__return_storage_ptr__,PP_particle *this,PP_particle *c)

{
  PP_COORD local_50;
  PP_COORD local_38;
  PP_particle *local_20;
  PP_particle *c_local;
  PP_particle *this_local;
  
  local_20 = c;
  c_local = this;
  this_local = __return_storage_ptr__;
  PP_COORD::operator=(&local_38,&(this->super_PP_object).coord,&(c->super_PP_object).coord);
  PP_COORD::~PP_COORD(&local_38);
  PP_COORD::operator=(&local_50,&(this->super_PP_object).v,&(local_20->super_PP_object).v);
  PP_COORD::~PP_COORD(&local_50);
  (this->super_PP_object).R = (local_20->super_PP_object).R;
  this->m = local_20->m;
  this->e = local_20->e;
  PP_particle(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

PP_particle PP_particle::operator= (PP_particle & c)
{
    coord=c.coord;
    v=c.v;
    R=c.R;
    m=c.m;
    e=c.e;
    return *this;
}